

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::IsIn(Var argProperty,Var instance,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined8 uVar2;
  RecyclableObject *pRVar3;
  ScriptContext *instance_00;
  bool bVar4;
  BOOL BVar5;
  PropertyId PVar6;
  PropertyRecord *this;
  undefined4 *puVar7;
  Var pvVar8;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  Var value;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *cacheOwner;
  IndexType indexType;
  uint32 index;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_30;
  BOOL result;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var instance_local;
  Var argProperty_local;
  
  object = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)instance;
  instance_local = argProperty;
  BVar5 = IsObject(instance);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)object,-0x7ff5ec2e,L"in");
  }
  pRStack_30 = VarTo<Js::RecyclableObject>(scriptContext_local);
  _indexType = (PropertyRecord *)0x0;
  bVar4 = GetPropertyRecordUsageCache
                    (instance_local,(ScriptContext *)object,(PropertyRecordUsageCache **)&value,
                     (RecyclableObject **)&propertyRecordUsageCache);
  if (bVar4) {
    _indexType = PropertyRecordUsageCache::GetPropertyRecord((PropertyRecordUsageCache *)value);
    bVar4 = PropertyRecord::IsNumeric(_indexType);
    if (!bVar4) {
      PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_a0);
      bVar4 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,true,false>
                        ((PropertyRecordUsageCache *)value,scriptContext_local,pRStack_30,
                         (Var *)&info.inlineCacheIndex,(ScriptContext *)object,
                         (PropertyValueInfo *)local_a0,(RecyclableObject *)propertyRecordUsageCache,
                         (PropertyCacheOperationInfo *)0x0);
      instance_00 = scriptContext_local;
      pRVar3 = pRStack_30;
      if (bVar4) {
        bVar4 = VarIs<Js::JavascriptBoolean>((Var)info._56_8_);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1ecc,"(VarIs<JavascriptBoolean>(value))",
                                      "VarIs<JavascriptBoolean>(value)");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        return (Var)info._56_8_;
      }
      this = PropertyRecordUsageCache::GetPropertyRecord((PropertyRecordUsageCache *)value);
      PVar6 = PropertyRecord::GetPropertyId(this);
      propertyRecord._4_4_ =
           GetPropertyWPCache<true,int>
                     (instance_00,pRVar3,PVar6,(Var *)&info.inlineCacheIndex,(ScriptContext *)object
                      ,(PropertyValueInfo *)local_a0);
      uVar2 = info._56_8_;
      pvVar8 = JavascriptBoolean::ToVar(propertyRecord._4_4_,(ScriptContext *)object);
      if ((Var)uVar2 != pvVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1ed0,
                                    "(value == JavascriptBoolean::ToVar(result, scriptContext))",
                                    "value == JavascriptBoolean::ToVar(result, scriptContext)");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      return (Var)info._56_8_;
    }
    cacheOwner._4_4_ = PropertyRecord::GetNumericValue(_indexType);
    cacheOwner._0_4_ = IndexType_Number;
  }
  else {
    cacheOwner._0_4_ =
         GetIndexType(&instance_local,(ScriptContext *)object,(uint32 *)((long)&cacheOwner + 4),
                      (PropertyRecord **)&indexType,true);
  }
  pRVar3 = pRStack_30;
  if ((IndexType)cacheOwner == IndexType_Number) {
    propertyRecord._4_4_ = HasItem(pRStack_30,cacheOwner._4_4_);
  }
  else {
    PVar6 = PropertyRecord::GetPropertyId(_indexType);
    propertyRecord._4_4_ = HasProperty(pRVar3,PVar6);
  }
  pvVar8 = JavascriptBoolean::ToVar(propertyRecord._4_4_,(ScriptContext *)object);
  return pvVar8;
}

Assistant:

Var JavascriptOperators::IsIn(Var argProperty, Var instance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_IsIn);
        // Note that the fact that we haven't seen a given name before doesn't mean that the instance doesn't

        if (!IsObject(instance))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Operand_Invalid_NeedObject, _u("in"));
        }

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        BOOL result;
        PropertyRecord const * propertyRecord = nullptr;
        uint32 index;
        IndexType indexType;

        // Fast path for JavascriptSymbols and PropertyStrings
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (GetPropertyRecordUsageCache(argProperty, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            Var value;
            propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
            if (!propertyRecord->IsNumeric())
            {
                PropertyValueInfo info;
                if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, true /* OutputExistence */, false /* ReturnOperationInfo */>(instance, object, &value, scriptContext, &info, cacheOwner, nullptr))
                {
                    Assert(VarIs<JavascriptBoolean>(value));
                    return value;
                }
                result = JavascriptOperators::GetPropertyWPCache<true /* OutputExistence */>(instance, object, propertyRecordUsageCache->GetPropertyRecord()->GetPropertyId(), &value, scriptContext, &info);
                Assert(value == JavascriptBoolean::ToVar(result, scriptContext));
                return value;
            }

            // We don't cache numeric property lookups, so fall through to the IndexType_Number case
            index = propertyRecord->GetNumericValue();
            indexType = IndexType_Number;
        }
        else
        {
            indexType = GetIndexType(argProperty, scriptContext, &index, &propertyRecord, true);
        }

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::HasItem(object, index);
        }
        else
        {
            result = JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());

#ifdef TELEMETRY_JSO
            {
                Assert(indexType != Js::IndexType_JavascriptString);
                if (indexType == Js::IndexType_PropertyId)
                {
                    scriptContext->GetTelemetry().GetOpcodeTelemetry().IsIn(instance, propertyId, result != 0);
                }
            }
#endif
        }
        return JavascriptBoolean::ToVar(result, scriptContext);
        JIT_HELPER_END(Op_IsIn);
    }